

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int Train(string *alphabetFile,string *datasetFile,string *resultModelFile)

{
  undefined1 local_120 [8];
  TLangModel model;
  
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_120);
  NJamSpell::TLangModel::Train((TLangModel *)local_120,datasetFile,alphabetFile);
  NJamSpell::TLangModel::Dump((TLangModel *)local_120,resultModelFile);
  NJamSpell::TLangModel::~TLangModel((TLangModel *)local_120);
  return 0;
}

Assistant:

int Train(const std::string& alphabetFile,
          const std::string& datasetFile,
          const std::string& resultModelFile)
{
    TLangModel model;
    model.Train(datasetFile, alphabetFile);
    model.Dump(resultModelFile);
    return 0;
}